

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall luna::Lexer::LexComment(Lexer *this)

{
  int iVar1;
  
  iVar1 = Next(this);
  this->current_ = iVar1;
  if (iVar1 == 0x5b) {
    iVar1 = Next(this);
    this->current_ = iVar1;
    if (iVar1 == 0x5b) {
      LexMultiLineComment(this);
      return;
    }
    while ((0xe < iVar1 + 1U || ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) == 0))) {
      iVar1 = Next(this);
      this->current_ = iVar1;
    }
  }
  else {
    while ((0xe < iVar1 + 1U || ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) == 0))) {
      iVar1 = Next(this);
      this->current_ = iVar1;
    }
  }
  return;
}

Assistant:

void Lexer::LexComment()
    {
        current_ = Next();
        if (current_ == '[')
        {
            current_ = Next();
            if (current_ == '[')
                LexMultiLineComment();
            else
                LexSingleLineComment();
        }
        else
            LexSingleLineComment();
    }